

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall wabt::interp::Thread::DoTableCopy(Thread *this,Instr instr,Ptr *out_trap)

{
  Table *src;
  Table *dst;
  Result RVar1;
  RunResult RVar2;
  Store *pSVar3;
  Value VVar4;
  Value VVar5;
  Value VVar6;
  Ptr table_dst;
  RefPtr<wabt::interp::Table> local_a8;
  RefPtr<wabt::interp::Table> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  RefPtr<wabt::interp::Trap> local_48;
  
  RefPtr<wabt::interp::Table>::RefPtr
            (&local_88,this->store_,
             (Ref)(this->inst_->tables_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[instr.field_2.imm_u32].index);
  RefPtr<wabt::interp::Table>::RefPtr
            (&local_a8,this->store_,
             (Ref)(this->inst_->tables_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[instr.field_2.imm_u32x2.snd].index);
  src = local_a8.obj_;
  VVar4 = Pop(this);
  VVar5 = Pop(this);
  dst = local_88.obj_;
  pSVar3 = (Store *)this;
  VVar6 = Pop(this);
  RVar1 = Table::Copy(pSVar3,dst,VVar6.field_0.i32_,src,VVar5.field_0.i32_,VVar4.field_0.i32_);
  RVar2 = Ok;
  if (RVar1.enum_ == Error) {
    pSVar3 = this->store_;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"out of bounds table access: table.copy out of bounds","");
    Store::
    Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
              (&local_48,pSVar3,pSVar3,&local_68,&this->frames_);
    out_trap->obj_ = local_48.obj_;
    out_trap->store_ = local_48.store_;
    out_trap->root_index_ = local_48.root_index_;
    local_48.obj_ = (Trap *)0x0;
    local_48.store_ = (Store *)0x0;
    local_48.root_index_ = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    RVar2 = Trap;
  }
  if (local_a8.obj_ != (Table *)0x0) {
    Store::DeleteRoot(local_a8.store_,local_a8.root_index_);
    local_a8.obj_ = (Table *)0x0;
    local_a8.store_ = (Store *)0x0;
    local_a8.root_index_ = 0;
  }
  if (local_88.obj_ != (Table *)0x0) {
    Store::DeleteRoot(local_88.store_,local_88.root_index_);
  }
  return RVar2;
}

Assistant:

RunResult Thread::DoTableCopy(Instr instr, Trap::Ptr* out_trap) {
  Table::Ptr table_dst{store_, inst_->tables()[instr.imm_u32x2.fst]};
  Table::Ptr table_src{store_, inst_->tables()[instr.imm_u32x2.snd]};
  u64 size = PopPtr(table_src);
  u64 src = PopPtr(table_src);
  u64 dst = PopPtr(table_dst);
  TRAP_IF(Failed(Table::Copy(store_, *table_dst, dst, *table_src, src, size)),
          "out of bounds table access: table.copy out of bounds");
  return RunResult::Ok;
}